

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

SESSION_HANDLE
session_create_from_endpoint
          (CONNECTION_HANDLE connection,ENDPOINT_HANDLE endpoint,ON_LINK_ATTACHED on_link_attached,
          void *callback_context)

{
  SESSION_INSTANCE *session_instance;
  SESSION_HANDLE pSVar1;
  
  if (endpoint != (ENDPOINT_HANDLE)0x0) {
    session_instance = (SESSION_INSTANCE *)calloc(1,0x70);
    pSVar1 = (SESSION_HANDLE)0x0;
    if (session_instance != (SESSION_INSTANCE *)0x0) {
      session_instance->connection = connection;
      session_instance->link_endpoints = (LINK_ENDPOINT_INSTANCE **)0x0;
      session_instance->link_endpoint_count = 0;
      session_instance->next_outgoing_id = 0;
      session_instance->desired_incoming_window = 1;
      session_instance->incoming_window = 1;
      session_instance->outgoing_window = 1;
      session_instance->handle_max = 0xffffffff;
      session_instance->remote_incoming_window = 0;
      session_instance->remote_outgoing_window = 0;
      session_instance->field_0x68 = session_instance->field_0x68 & 0xfe;
      session_instance->session_state = SESSION_STATE_UNMAPPED;
      session_instance->previous_session_state = SESSION_STATE_UNMAPPED;
      session_instance->on_link_attached = on_link_attached;
      session_instance->on_link_attached_callback_context = callback_context;
      session_instance->endpoint = endpoint;
      session_set_state(session_instance,SESSION_STATE_UNMAPPED);
      pSVar1 = session_instance;
    }
    return pSVar1;
  }
  return (SESSION_HANDLE)0x0;
}

Assistant:

SESSION_HANDLE session_create_from_endpoint(CONNECTION_HANDLE connection, ENDPOINT_HANDLE endpoint, ON_LINK_ATTACHED on_link_attached, void* callback_context)
{
    SESSION_INSTANCE* result;

    if (endpoint == NULL)
    {
        result = NULL;
    }
    else
    {
        result = (SESSION_INSTANCE*)calloc(1, sizeof(SESSION_INSTANCE));
        if (result != NULL)
        {
            result->connection = connection;
            result->link_endpoints = NULL;
            result->link_endpoint_count = 0;
            result->handle_max = 4294967295u;

            result->next_outgoing_id = 0;

            result->desired_incoming_window = 1;
            result->incoming_window = 1;
            result->outgoing_window = 1;
            result->handle_max = 4294967295u;
            result->remote_incoming_window = 0;
            result->remote_outgoing_window = 0;
            result->previous_session_state = SESSION_STATE_UNMAPPED;
            result->is_underlying_connection_open = UNDERLYING_CONNECTION_NOT_OPEN;
            result->session_state = SESSION_STATE_UNMAPPED;
            result->on_link_attached = on_link_attached;
            result->on_link_attached_callback_context = callback_context;

            result->endpoint = endpoint;
            session_set_state(result, SESSION_STATE_UNMAPPED);
        }
    }

    return result;
}